

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char *zLeft;
  bool bVar2;
  int iVar3;
  int iVar4;
  Fts5Tokenizer *__dest;
  byte *pbVar5;
  long lVar6;
  
  if ((nArg & 1U) == 0) {
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      __dest = (Fts5Tokenizer *)sqlite3Malloc(0x80);
    }
    else {
      __dest = (Fts5Tokenizer *)0x0;
    }
    iVar3 = 0;
    if (__dest != (Fts5Tokenizer *)0x0) {
      memcpy(__dest,"",0x80);
      if (nArg < 1) {
        bVar2 = true;
      }
      else {
        lVar6 = 0;
        do {
          zLeft = azArg[lVar6];
          iVar3 = 1;
          if (zLeft == (char *)0x0) {
LAB_001b0b51:
            bVar2 = false;
          }
          else {
            pbVar5 = (byte *)azArg[lVar6 + 1];
            iVar4 = sqlite3StrICmp(zLeft,"tokenchars");
            if (iVar4 == 0) {
              iVar3 = 0;
              bVar2 = true;
              bVar1 = *pbVar5;
              while (bVar1 != 0) {
                pbVar5 = pbVar5 + 1;
                if (-1 < (char)bVar1) {
                  __dest[bVar1] = (Fts5Tokenizer)0x1;
                }
                bVar1 = *pbVar5;
              }
            }
            else {
              if (zLeft == (char *)0x0) goto LAB_001b0b51;
              iVar4 = sqlite3StrICmp(zLeft,"separators");
              bVar2 = false;
              if (iVar4 == 0) {
                bVar2 = true;
                bVar1 = *pbVar5;
                while (bVar1 != 0) {
                  pbVar5 = pbVar5 + 1;
                  if (-1 < (char)bVar1) {
                    __dest[bVar1] = (Fts5Tokenizer)0x0;
                  }
                  bVar1 = *pbVar5;
                }
                iVar3 = 0;
              }
            }
          }
        } while ((bVar2) && (lVar6 = lVar6 + 2, (int)lVar6 < nArg));
      }
      if (!bVar2) {
        sqlite3_free(__dest);
        __dest = (Fts5Tokenizer *)0x0;
      }
      goto LAB_001b0bb0;
    }
    iVar3 = 7;
  }
  else {
    iVar3 = 1;
  }
  __dest = (Fts5Tokenizer *)0x0;
LAB_001b0bb0:
  *ppOut = __dest;
  return iVar3;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}